

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall google::protobuf::io::Printer::push_back(Printer *this,char c)

{
  int iVar1;
  char *in_RAX;
  char *local_28;
  
  if (this->failed_ == false) {
    if (this->buffer_size_ == 0) {
      local_28 = in_RAX;
      do {
        iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                          (this->output_,&local_28,&this->buffer_size_);
        if ((char)iVar1 == '\0') {
          this->failed_ = true;
          return;
        }
        this->buffer_ = local_28;
      } while (this->buffer_size_ == 0);
    }
    else {
      local_28 = this->buffer_;
    }
    this->buffer_ = local_28 + 1;
    *local_28 = c;
    this->buffer_size_ = this->buffer_size_ + -1;
    this->offset_ = this->offset_ + 1;
  }
  return;
}

Assistant:

void push_back(char c) {
    if (failed_) return;
    if (buffer_size_ == 0) {
      if (!Next()) return;
    }
    *buffer_++ = c;
    buffer_size_--;
    offset_++;
  }